

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

logical pnga_allocate(Integer g_a)

{
  ushort uVar1;
  global_array_t *pgVar2;
  ushort uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  C_Integer *pCVar7;
  global_array_t *pgVar8;
  logical lVar9;
  Integer *pIVar10;
  long lVar11;
  int grp_id;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  Integer IVar16;
  Integer IVar17;
  long lVar18;
  C_Integer CVar19;
  long lVar20;
  ulong local_1c0;
  long local_1b8;
  Integer local_1b0;
  Integer hi [7];
  Integer dims [7];
  Integer blk [7];
  Integer chunk [7];
  Integer pe [7];
  Integer width [7];
  
  IVar17 = GAme;
  IVar16 = GAnproc;
  lVar11 = g_a + 1000;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (GA[lVar11].ndim == -1) {
    pnga_error("Insufficient data to create global array",0);
  }
  iVar4 = GA_Default_Proc_Group;
  grp_id = GA[lVar11].p_handle;
  if (GA[lVar11].p_handle == GA_Init_Proc_Group) {
    GA[lVar11].p_handle = GA_Default_Proc_Group;
    grp_id = iVar4;
  }
  lVar20 = (long)grp_id;
  pnga_pgroup_sync(lVar20);
  if (0 < grp_id) {
    IVar16 = (Integer)PGRP_LIST[lVar20].map_nproc;
    IVar17 = (Integer)PGRP_LIST[lVar20].map_proc_list[GAme];
  }
  if (GAinitialized == '\0') {
    pnga_error("GA not initialized ",0);
  }
  local_1b8 = lVar20;
  local_1b0 = IVar17;
  if (ma_address_init == '\0') {
    gai_ma_address_init();
  }
  pgVar8 = GA;
  uVar1 = GA[lVar11].ndim;
  lVar18 = (long)(short)uVar1;
  lVar5 = 0;
  lVar20 = 0;
  if (0 < lVar18) {
    lVar20 = lVar18;
  }
  for (; lVar20 != lVar5; lVar5 = lVar5 + 1) {
    width[lVar5] = GA[g_a + 1000].width[lVar5];
  }
  if (GA[lVar11].distr_type == 0 && GA[lVar11].mapc == (C_Integer *)0x0) {
    for (lVar5 = 0; lVar20 != lVar5; lVar5 = lVar5 + 1) {
      dims[lVar5] = GA[g_a + 1000].dims[lVar5];
      chunk[lVar5] = GA[g_a + 1000].chunk[lVar5];
    }
    if (CONCAT44(chunk[0]._4_4_,(undefined4)chunk[0]) == 0) {
      for (lVar5 = 0; lVar20 != lVar5; lVar5 = lVar5 + 1) {
        blk[lVar5] = -1;
      }
    }
    else {
      for (lVar5 = 0; lVar20 != lVar5; lVar5 = lVar5 + 1) {
        lVar13 = dims[lVar5];
        if (chunk[lVar5] < dims[lVar5]) {
          lVar13 = chunk[lVar5];
        }
        blk[lVar5] = lVar13;
      }
    }
    for (lVar5 = 0; lVar20 != lVar5; lVar5 = lVar5 + 1) {
      if (dims[lVar5] == 1) {
        blk[lVar5] = 1;
      }
    }
    pnga_pgroup_sync(local_1b8);
    if (grp_id == 0) {
      IVar16 = (long)PGRP_LIST->map_nproc;
    }
    else if (GA[lVar11].num_rstrctd != 0) {
      IVar16 = GA[lVar11].num_rstrctd;
    }
    ddb_h2(lVar18,dims,IVar16,0.0,0,blk,pe);
    pIVar10 = mapALL;
    for (lVar5 = 0; pgVar8 = GA, lVar5 != lVar20; lVar5 = lVar5 + 1) {
      lVar18 = chunk[lVar5];
      lVar13 = dims[lVar5];
      if (lVar18 < 2) {
        IVar16 = pe[lVar5];
        lVar13 = lVar13 - (blk[lVar5] + -1) * IVar16;
      }
      else {
        lVar6 = lVar13;
        if (lVar18 < lVar13) {
          lVar6 = lVar18;
        }
        IVar16 = pe[lVar5];
        lVar13 = (lVar13 + -1) / lVar6 + (1 - blk[lVar5]) * IVar16 + 1;
      }
      lVar6 = 0;
      for (lVar12 = 0; (lVar6 < IVar16 && (lVar12 < dims[lVar5])); lVar12 = lVar12 + lVar14) {
        lVar14 = blk[lVar5] - (ulong)(lVar13 <= lVar6);
        pIVar10[lVar6] = lVar12 + 1;
        if (1 < lVar18) {
          lVar15 = dims[lVar5];
          if (lVar18 < dims[lVar5]) {
            lVar15 = lVar18;
          }
          lVar14 = lVar14 * lVar15;
        }
        lVar6 = lVar6 + 1;
        IVar16 = pe[lVar5];
      }
      if (IVar16 < lVar6) {
        lVar6 = IVar16;
      }
      pe[lVar5] = lVar6;
      pIVar10 = pIVar10 + lVar6;
    }
    lVar18 = 0;
    for (lVar5 = 0; lVar20 != lVar5; lVar5 = lVar5 + 1) {
      lVar13 = pe[lVar5];
      pgVar8[g_a + 1000].nblock[lVar5] = (int)lVar13;
      lVar18 = lVar18 + lVar13;
    }
    pCVar7 = (C_Integer *)malloc(lVar18 * 8 + 8);
    GA[lVar11].mapc = pCVar7;
    pIVar10 = mapALL;
    pgVar2 = GA + lVar11;
    lVar13 = 0;
    lVar5 = 0;
    if (0 < lVar18) {
      lVar5 = lVar18;
    }
    for (; pgVar8 = GA, lVar5 != lVar13; lVar13 = lVar13 + 1) {
      pgVar2->mapc[lVar13] = pIVar10[lVar13];
    }
    GA[lVar11].mapc[lVar18] = -1;
    lVar5 = 0;
  }
  else {
    switch(GA[lVar11].distr_type) {
    case 1:
      lVar13 = GA[lVar11].block_total;
      lVar5 = 0;
      uVar3 = 0;
      if (0 < (short)uVar1) {
        uVar3 = uVar1;
      }
      for (IVar16 = GAme; IVar16 < lVar13; IVar16 = IVar16 + GAnproc) {
        lVar14 = (long)(int)IVar16 % GA[lVar11].num_blocks[0];
        chunk[0]._0_4_ = (int)lVar14;
        lVar6 = IVar16;
        lVar12 = 0;
        while (lVar12 + 1 < lVar18) {
          lVar6 = (long)((int)lVar6 - (int)lVar14) / GA[g_a + 1000].num_blocks[lVar12];
          lVar14 = (long)(int)lVar6 % GA[g_a + 1000].num_blocks[lVar12 + 1];
          *(int *)((long)chunk + lVar12 * 4 + 4) = (int)lVar14;
          lVar12 = lVar12 + 1;
        }
        for (lVar6 = 0; (ulong)uVar3 * 4 != lVar6; lVar6 = lVar6 + 4) {
          iVar4 = *(int *)((long)chunk + lVar6);
          lVar12 = *(long *)((long)GA[g_a + 1000].block_dims + lVar6 * 2);
          *(long *)((long)dims + lVar6 * 2) = lVar12 * iVar4 + 1;
          lVar12 = ((long)iVar4 + 1) * lVar12;
          lVar14 = *(long *)((long)GA[g_a + 1000].dims + lVar6 * 2);
          if (lVar14 <= lVar12) {
            lVar12 = lVar14;
          }
          *(long *)((long)hi + lVar6 * 2) = lVar12;
        }
        lVar6 = 1;
        for (lVar12 = 0; lVar20 != lVar12; lVar12 = lVar12 + 1) {
          lVar6 = lVar6 * ((hi[lVar12] - dims[lVar12]) + 1);
        }
        lVar5 = lVar5 + lVar6;
      }
      break;
    case 2:
      lVar13 = GAme % (long)GA[lVar11].nblock[0];
      hi[0] = lVar13;
      IVar16 = GAme;
      lVar5 = 0;
      while (lVar5 + 1 < lVar18) {
        IVar16 = (IVar16 - lVar13) / (long)GA[g_a + 1000].nblock[lVar5];
        lVar13 = IVar16 % (long)GA[g_a + 1000].nblock[lVar5 + 1];
        hi[lVar5 + 1] = lVar13;
        lVar5 = lVar5 + 1;
      }
      lVar5 = 1;
      for (lVar18 = 0; lVar20 != lVar18; lVar18 = lVar18 + 1) {
        lVar5 = lVar5 * GA[lVar11].nblock[lVar18];
      }
      lVar18 = GA[lVar11].num_rstrctd;
      if (lVar18 == 0) {
        lVar18 = pnga_pgroup_nnodes((long)GA[lVar11].p_handle);
      }
      if (lVar5 != lVar18) {
        pnga_error("Number of processors in processor grid must equal available processors",0);
        pgVar8 = GA;
      }
      lVar5 = 1;
      for (lVar18 = 0; lVar18 != lVar20; lVar18 = lVar18 + 1) {
        lVar13 = 0;
        for (IVar16 = hi[lVar18]; IVar16 < pgVar8[lVar11].num_blocks[lVar18];
            IVar16 = IVar16 + pgVar8[lVar11].nblock[lVar18]) {
          lVar6 = (IVar16 + 1) * pgVar8[lVar11].block_dims[lVar18];
          if (pgVar8[lVar11].dims[lVar18] <= lVar6) {
            lVar6 = pgVar8[lVar11].dims[lVar18];
          }
          lVar13 = (lVar13 - pgVar8[lVar11].block_dims[lVar18] * IVar16) + lVar6;
        }
        lVar5 = lVar5 * lVar13;
      }
      break;
    case 3:
      lVar13 = GAme % (long)GA[lVar11].nblock[0];
      hi[0] = lVar13;
      IVar16 = GAme;
      lVar5 = 0;
      while (lVar5 + 1 < lVar18) {
        IVar16 = (IVar16 - lVar13) / (long)GA[g_a + 1000].nblock[lVar5];
        lVar13 = IVar16 % (long)GA[g_a + 1000].nblock[lVar5 + 1];
        hi[lVar5 + 1] = lVar13;
        lVar5 = lVar5 + 1;
      }
      lVar5 = 1;
      for (lVar18 = 0; lVar20 != lVar18; lVar18 = lVar18 + 1) {
        lVar5 = lVar5 * GA[lVar11].nblock[lVar18];
      }
      lVar18 = GA[lVar11].num_rstrctd;
      if (lVar18 == 0) {
        lVar18 = pnga_pgroup_nnodes((long)GA[lVar11].p_handle);
      }
      if (lVar5 != lVar18) {
        pnga_error("Number of processors in processor grid must equal available processors",0);
        pgVar8 = GA;
      }
      lVar5 = 1;
      for (lVar18 = 0; lVar18 != lVar20; lVar18 = lVar18 + 1) {
        lVar13 = 0;
        for (IVar16 = hi[lVar18]; IVar16 < pgVar8[lVar11].num_blocks[lVar18];
            IVar16 = IVar16 + pgVar8[lVar11].nblock[lVar18]) {
          lVar6 = (IVar16 + 1) * pgVar8[lVar11].block_dims[lVar18];
          if (pgVar8[lVar11].dims[lVar18] <= lVar6) {
            lVar6 = pgVar8[lVar11].dims[lVar18];
          }
          lVar13 = (lVar13 - pgVar8[lVar11].block_dims[lVar18] * IVar16) + lVar6;
        }
        lVar5 = lVar5 * lVar13;
      }
      break;
    case 4:
      lVar5 = 1;
      lVar6 = GAme % (long)GA[lVar11].nblock[0];
      hi[0] = lVar6;
      IVar16 = GAme;
      lVar13 = 0;
      while (lVar13 + 1 < lVar18) {
        IVar16 = (IVar16 - lVar6) / (long)GA[g_a + 1000].nblock[lVar13];
        lVar6 = IVar16 % (long)GA[g_a + 1000].nblock[lVar13 + 1];
        hi[lVar13 + 1] = lVar6;
        lVar13 = lVar13 + 1;
      }
      for (lVar18 = 0; lVar20 != lVar18; lVar18 = lVar18 + 1) {
        lVar5 = lVar5 * GA[lVar11].nblock[lVar18];
      }
      lVar18 = GA[lVar11].num_rstrctd;
      if (lVar18 == 0) {
        lVar18 = pnga_pgroup_nnodes((long)GA[lVar11].p_handle);
      }
      if (lVar5 != lVar18) {
        pnga_error("Number of processors in processor grid must equal available processors",0);
        pgVar8 = GA;
      }
      lVar5 = 1;
      lVar13 = 0;
      for (lVar18 = 0; lVar18 != lVar20; lVar18 = lVar18 + 1) {
        lVar6 = pgVar8[lVar11].num_blocks[lVar18];
        lVar12 = 0;
        for (IVar16 = hi[lVar18]; IVar16 < lVar6; IVar16 = IVar16 + pgVar8[lVar11].nblock[lVar18]) {
          if (IVar16 < lVar6 + -1) {
            CVar19 = pgVar8[lVar11].mapc[lVar13 + IVar16 + 1] + -1;
          }
          else {
            CVar19 = pgVar8[lVar11].dims[lVar18];
          }
          lVar12 = (lVar12 - pgVar8[lVar11].mapc[lVar13 + IVar16]) + CVar19 + 1;
        }
        lVar5 = lVar5 * lVar12;
        lVar13 = lVar13 + lVar6;
      }
      break;
    default:
      lVar5 = 0;
    }
  }
  GAstat.numcre = GAstat.numcre + 1;
  pgVar8[lVar11].actv = 1;
  IVar16 = pnga_cluster_nnodes();
  pgVar8 = GA;
  if ((IVar16 == 1) && (GA[lVar11].p_handle == 0)) {
    GA[lVar11].p_handle = -1;
  }
  if (pgVar8[lVar11].distr_type == 0) {
    for (lVar5 = 0; lVar20 != lVar5; lVar5 = lVar5 + 1) {
      pgVar8[g_a + 1000].scale[lVar5] =
           (double)pgVar8[g_a + 1000].nblock[lVar5] / (double)pgVar8[g_a + 1000].dims[lVar5];
    }
    pnga_set_ghost_corner_flag(g_a,lVar20);
    IVar16 = local_1b0;
    if (grp_id == 0) {
      IVar16 = (Integer)PGRP_LIST->map_proc_list[GAme];
    }
    pnga_distribution(g_a,IVar16,GA[lVar11].lo,hi);
    if ((GA[lVar11].num_rstrctd == 0) || (GA[lVar11].has_data == 1)) {
      lVar18 = 1;
      for (lVar5 = 0; lVar20 != lVar5; lVar5 = lVar5 + 1) {
        lVar18 = lVar18 * ((hi[lVar5] - GA[g_a + 1000].lo[lVar5]) + width[lVar5] * 2 + 1);
      }
    }
    else {
      lVar18 = 0;
    }
    lVar5 = (long)GA[lVar11].elemsize;
    pgVar8 = GA;
  }
  else {
    lVar18 = (long)pgVar8[lVar11].elemsize;
    for (lVar13 = 0; lVar20 != lVar13; lVar13 = lVar13 + 1) {
      pgVar8[lVar11].scale[lVar13] =
           (double)pgVar8[lVar11].num_blocks[lVar13] / (double)pgVar8[lVar11].dims[lVar13];
    }
  }
  lVar20 = local_1b8;
  lVar5 = lVar5 * lVar18;
  pgVar8[lVar11].id = -1;
  pgVar8[lVar11].size = lVar5;
  if (GA_memory_limited == '\x01') {
    GA_total_memory = GA_total_memory - lVar5;
    local_1c0 = (ulong)~GA_total_memory >> 0x3f;
    IVar16 = pnga_type_f2c(0x3f2);
    if (grp_id < 1) {
      pnga_gop(IVar16,&local_1c0,1,"&&");
    }
    else {
      pnga_pgroup_gop(lVar20,IVar16,&local_1c0,1,"&&");
    }
    pgVar8 = GA;
    if (local_1c0 == 0) {
      GA[lVar11].ptr[local_1b0] = (char *)0x0;
      goto LAB_001697ab;
    }
  }
  else {
    local_1c0 = 1;
  }
  if (pgVar8[lVar11].mem_dev_set == 0) {
    iVar4 = gai_get_shmem(pgVar8[lVar11].ptr,lVar5,pgVar8[lVar11].type,&pgVar8[lVar11].id,grp_id);
  }
  else {
    iVar4 = gai_get_devmem(pgVar8[lVar11].mem_dev,pgVar8[lVar11].ptr,lVar5,pgVar8[lVar11].type,
                           &pgVar8[lVar11].id,grp_id,pgVar8[lVar11].mem_dev_set,
                           pgVar8[lVar11].mem_dev);
  }
  local_1c0 = (ulong)(iVar4 == 0);
LAB_001697ab:
  if (((GA[lVar11].distr_type == 0) && (GA[lVar11].ghosts == 1)) &&
     (lVar9 = pnga_set_ghost_info(g_a), lVar9 == 0)) {
    pnga_error("Could not allocate update information for ghost cells",0);
  }
  pnga_pgroup_sync(lVar20);
  if (local_1c0 == 0) {
    if (GA_memory_limited == '\x01') {
      GA_total_memory = GA_total_memory + lVar5;
    }
    pnga_destroy(g_a);
    lVar9 = 0;
  }
  else {
    GAstat.curmem = GAstat.curmem + GA[lVar11].size;
    lVar11 = GAstat.curmem;
    if (GAstat.curmem < GAstat.maxmem) {
      lVar11 = GAstat.maxmem;
    }
    lVar9 = 1;
    GAstat.maxmem = lVar11;
  }
  return lVar9;
}

Assistant:

logical pnga_allocate(Integer g_a)
{

  Integer hi[MAXDIM];
  Integer ga_handle = g_a + GA_OFFSET;
  Integer d, width[MAXDIM], ndim;
  Integer mem_size, nelem, pnum;
  Integer i, status, maplen=0, p_handle;
  Integer dims[MAXDIM], chunk[MAXDIM];
  Integer pe[MAXDIM], *pmap[MAXDIM], *map;
  Integer blk[MAXDIM];
  Integer grp_me=GAme, grp_nproc=GAnproc;
  Integer block_size = 0;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  if (GA[ga_handle].ndim == -1)
    pnga_error("Insufficient data to create global array",0);

  p_handle = (Integer)GA[ga_handle].p_handle;
  if (p_handle == (Integer)GA_Init_Proc_Group) {
    GA[ga_handle].p_handle = GA_Default_Proc_Group;
    p_handle = GA_Default_Proc_Group;
  }
  pnga_pgroup_sync(p_handle);

  if (p_handle > 0) {
     grp_nproc  = PGRP_LIST[p_handle].map_nproc;
     grp_me = PGRP_LIST[p_handle].map_proc_list[GAme];
  }
  
  if(!GAinitialized) pnga_error("GA not initialized ", 0);
  if(!ma_address_init) gai_ma_address_init();

  ndim = GA[ga_handle].ndim;
  for (i=0; i<ndim; i++) width[i] = (C_Integer)GA[ga_handle].width[i];

  /* The data distribution has not been specified by the user. Create
     default distribution */
  if (GA[ga_handle].mapc == NULL && GA[ga_handle].distr_type == REGULAR) {
    for (d=0; d<ndim; d++) {
      dims[d] = (Integer)GA[ga_handle].dims[d];
      chunk[d] = (Integer)GA[ga_handle].chunk[d];
    }
    if(chunk[0]!=0) /* for chunk[0]=0 compute all */
      for(d=0; d< ndim; d++) blk[d]=(Integer)GA_MIN(chunk[d],dims[d]);
    else
      for(d=0; d< ndim; d++) blk[d]=-1;

    /* eliminate dimensions =1 from ddb analysis */
    for(d=0; d<ndim; d++)if(dims[d]==1)blk[d]=1;
 
    if (GAme==0 && DEBUG )
      for (d=0;d<ndim;d++) fprintf(stderr,"b[%ld]=%ld\n",(long)d,(long)blk[d]);
    pnga_pgroup_sync(p_handle);

    /* ddb(ndim, dims, GAnproc, blk, pe);*/
    if(p_handle == 0) /* for mirrored arrays */
#if OLD_DISTRIBUTION
       ddb_h2(ndim, dims, PGRP_LIST[p_handle].map_nproc,0.0,(Integer)0, blk, pe);
#else
       ddb(ndim, dims, PGRP_LIST[p_handle].map_nproc, blk, pe);
#endif
    else
       if (GA[ga_handle].num_rstrctd == 0) {
         /* Data is normally distributed on processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, grp_nproc,0.0,(Integer)0, blk, pe);
#else
         ddb(ndim, dims, grp_nproc, blk, pe);
#endif
       } else {
         /* Data is only distributed on subset of processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, GA[ga_handle].num_rstrctd, 0.0, (Integer)0, blk, pe);
#else
         ddb(ndim, dims, GA[ga_handle].num_rstrctd, blk, pe);
#endif
       }

    for(d=0, map=mapALL; d< ndim; d++){
      Integer nblock;
      Integer pcut; /* # procs that get full blk[] elements; the rest gets less*/
      int p;

      pmap[d] = map;

      /* RJH ... don't leave some nodes without data if possible
       but respect the users block size */
      
      if (chunk[d] > 1) {
        Integer ddim = ((dims[d]-1)/GA_MIN(chunk[d],dims[d]) + 1);
        pcut = (ddim -(blk[d]-1)*pe[d]) ;
      }
      else {
        pcut = (dims[d]-(blk[d]-1)*pe[d]) ;
      }

      for (nblock=i=p=0; (p<pe[d]) && (i<dims[d]); p++, nblock++) {
        Integer b = blk[d];
        if (p >= pcut)
          b = b-1;
        map[nblock] = i+1;
        if (chunk[d]>1) b *= GA_MIN(chunk[d],dims[d]);
        i += b;
      }

      pe[d] = GA_MIN(pe[d],nblock);
      map +=  pe[d]; 
    }
    if(GAme==0&& DEBUG){
      gai_print_subscript("pe ",(int)ndim, pe,"\n");
      gai_print_subscript("blocks ",(int)ndim, blk,"\n");
      printf("decomposition map\n");
      for(d=0; d< ndim; d++){
        printf("dim=%ld: ",(long)d); 
        for (i=0;i<pe[d];i++)printf("%ld ",(long)pmap[d][i]);
        printf("\n"); 
      }
      fflush(stdout);
    }
    maplen = 0;
    for( i = 0; i< ndim; i++){
      GA[ga_handle].nblock[i] = pe[i];
      maplen += pe[i];
    }
    GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
    for(i = 0; i< maplen; i++) {
      GA[ga_handle].mapc[i] = (C_Integer)mapALL[i];
    }
    GA[ga_handle].mapc[maplen] = -1;
  } else if (GA[ga_handle].distr_type == BLOCK_CYCLIC) {
    /* Regular block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer nblocks = GA[ga_handle].block_total;
    Integer tsize, j;
    Integer lo[MAXDIM];
    block_size = 0;
    for (i=GAme; i<nblocks; i +=GAnproc) {
      ga_ownsM(ga_handle,i,lo,hi);
      tsize = 1;
      for (j=0; j<ndim; j++) {
        tsize *= (hi[j] - lo[j] + 1);
      }
      block_size += tsize;
    }
  } else if (GA[ga_handle].distr_type == SCALAPACK) {
    /* ScaLAPACK block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax, tot;
    Integer index[MAXDIM];
    gam_find_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    tot = 1;
    for (i=0; i<GA[ga_handle].ndim; i++) {
      tot *= GA[ga_handle].nblock[i];
    }
    if (GA[ga_handle].num_rstrctd == 0) {
      pnum = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    } else {
      pnum = GA[ga_handle].num_rstrctd;
    }
    if (tot != pnum)
      pnga_error("Number of processors in processor grid must equal available processors",0);
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax, tot;
    Integer index[MAXDIM];
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    tot = 1;
    for (i=0; i<GA[ga_handle].ndim; i++) {
      tot *= GA[ga_handle].nblock[i];
    }
    if (GA[ga_handle].num_rstrctd == 0) {
      pnum = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    } else {
      pnum = GA[ga_handle].num_rstrctd;
    }
    if (tot != pnum)
      pnga_error("Number of processors in processor grid must equal available processors",0);
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax, tot;
    Integer index[MAXDIM];
    Integer offset = 0;
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    tot = 1;
    for (i=0; i<GA[ga_handle].ndim; i++) {
      tot *= GA[ga_handle].nblock[i];
    }
    if (GA[ga_handle].num_rstrctd == 0) {
      pnum = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    } else {
      pnum = GA[ga_handle].num_rstrctd;
    }
    if (tot != pnum)
      pnga_error("Number of processors in processor grid must equal available processors",0);
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = GA[ga_handle].mapc[offset+j];
        if (j<GA[ga_handle].num_blocks[i]-1) {
          imax = GA[ga_handle].mapc[offset+j+1]-1;
        } else {
          imax = GA[ga_handle].dims[i];
        }
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
      offset += GA[ga_handle].num_blocks[i];
    }
  }

  GAstat.numcre ++;

  GA[ga_handle].actv = 1;
  /* If only one node is being used and array is mirrored,
   * set proc list to world group */
  if (pnga_cluster_nnodes() == 1 && GA[ga_handle].p_handle == 0) {
    GA[ga_handle].p_handle = pnga_pgroup_get_world();
  }

  /* Set remaining parameters and determine memory size if regular data
   * distribution is being used */
  if (GA[ga_handle].distr_type == REGULAR) {
    /* set corner flag, if it has not already been set and set up message
       passing data */
    if (GA[ga_handle].corner_flag == -1) {
       i = 1;
    } else {
       i = GA[ga_handle].corner_flag;
    }
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].nblock[i]
         / (double)GA[ga_handle].dims[i];
    }
    pnga_set_ghost_corner_flag(g_a, i);
 
    /*** determine which portion of the array I am supposed to hold ***/
    if (p_handle == 0) { /* for mirrored arrays */
       Integer me_local = (Integer)PGRP_LIST[p_handle].map_proc_list[GAme];
       pnga_distribution(g_a, me_local, GA[ga_handle].lo, hi);
    } else {
       pnga_distribution(g_a, grp_me, GA[ga_handle].lo, hi);
    }
    if (GA[ga_handle].num_rstrctd == 0 || GA[ga_handle].has_data == 1) {
      for( i = 0, nelem=1; i< ndim; i++){
        /*
        GA[ga_handle].chunk[i] = ((C_Integer)hi[i]-GA[ga_handle].lo[i]+1);
        */
        nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1+2*width[i]);
      }
    } else {
      nelem = 0;
    }
    mem_size = nelem * GA[ga_handle].elemsize;
  } else {
    mem_size = block_size * GA[ga_handle].elemsize;
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].num_blocks[i]
         / (double)GA[ga_handle].dims[i];
    }
  }
  GA[ga_handle].id = INVALID_MA_HANDLE;
  GA[ga_handle].size = (C_Long)mem_size;
  /* if requested, enforce limits on memory consumption */
  if(GA_memory_limited) GA_total_memory -= mem_size;
  /* check if everybody has enough memory left */
  if(GA_memory_limited){
     status = (GA_total_memory >= 0) ? 1 : 0;
     if (p_handle > 0) {
        /* pnga_pgroup_gop(p_handle,pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
        pnga_pgroup_gop(p_handle,pnga_type_f2c(MT_F_INT), &status, 1, "&&");
     } else {
        /* pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
        pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "&&");
     }
  }else status = 1;

  if (status) {
    if (GA[ga_handle].mem_dev_set) {
      status = !gai_get_devmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
          GA[ga_handle].type, &GA[ga_handle].id, p_handle,
          GA[ga_handle].mem_dev_set, GA[ga_handle].mem_dev);
    } else {
      status = !gai_getmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
          GA[ga_handle].type, &GA[ga_handle].id, p_handle);
    }
  } else {
     GA[ga_handle].ptr[grp_me]=NULL;
  }

  if (GA[ga_handle].distr_type == REGULAR) {
    /* Finish setting up information for ghost cell updates */
    if (GA[ga_handle].ghosts == 1) {
      if (!pnga_set_ghost_info(g_a))
        pnga_error("Could not allocate update information for ghost cells",0);
    }
    /* If array is mirrored, evaluate first and last indices */
    /* ngai_get_first_last_indices(&g_a); */
  }

  pnga_pgroup_sync(p_handle);
  if (status) {
    GAstat.curmem += (long)GA[ga_handle].size;
    GAstat.maxmem  = (long)GA_MAX(GAstat.maxmem, GAstat.curmem);
    status = TRUE;
  } else {
    if(GA_memory_limited) GA_total_memory += mem_size;
    pnga_destroy(g_a);
    status = FALSE;
  }
  return status;
}